

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_getLanguage_63(char *localeID,char *language,int32_t languageCapacity,UErrorCode *err)

{
  int32_t iVar1;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (localeID == (char *)0x0) {
      localeID = locale_get_default_63();
    }
    iVar1 = ulocimp_getLanguage_63(localeID,language,languageCapacity,(char **)0x0);
    iVar1 = u_terminateChars_63(language,languageCapacity,iVar1,err);
    return iVar1;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getLanguage(const char*    localeID,
         char* language,
         int32_t languageCapacity,
         UErrorCode* err)
{
    /* uloc_getLanguage will return a 2 character iso-639 code if one exists. *CWB*/
    int32_t i=0;

    if (err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    i=ulocimp_getLanguage(localeID, language, languageCapacity, NULL);
    return u_terminateChars(language, languageCapacity, i, err);
}